

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool_p.h
# Opt level: O2

void __thiscall QThreadPoolPrivate::~QThreadPoolPrivate(QThreadPoolPrivate *this)

{
  (this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QThreadPoolPrivate_00668f08;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->objectName).d);
  QWaitCondition::~QWaitCondition(&this->noActiveThreads);
  QArrayDataPointer<QueuePage_*>::~QArrayDataPointer(&(this->queue).d);
  QArrayDataPointer<QThreadPoolThread_*>::~QArrayDataPointer
            ((QArrayDataPointer<QThreadPoolThread_*> *)&this->expiredThreads);
  QArrayDataPointer<QThreadPoolThread_*>::~QArrayDataPointer
            ((QArrayDataPointer<QThreadPoolThread_*> *)&this->waitingThreads);
  QHash<QThreadPoolThread_*,_QHashDummyValue>::~QHash(&(this->allThreads).q_hash);
  QMutex::~QMutex(&this->mutex);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

class Q_CORE_EXPORT QThreadPoolPrivate : public QObjectPrivate
{
    Q_DECLARE_PUBLIC(QThreadPool)
    friend class QThreadPoolThread;

public:
    QThreadPoolPrivate();

    bool tryStart(QRunnable *task);
    void enqueueTask(QRunnable *task, int priority = 0);
    int activeThreadCount() const;

    void tryToStartMoreThreads();
    bool areAllThreadsActive() const;
    bool tooManyThreadsActive() const;

    int maxThreadCount() const
    { return qMax(requestedMaxThreadCount, 1); }    // documentation says we start at least one
    void startThread(QRunnable *runnable = nullptr);
    void reset();
    bool waitForDone(const QDeadlineTimer &timer);
    void clear();
    void stealAndRunRunnable(QRunnable *runnable);
    void deletePageIfFinished(QueuePage *page);

    mutable QMutex mutex;
    QSet<QThreadPoolThread *> allThreads;
    QQueue<QThreadPoolThread *> waitingThreads;
    QQueue<QThreadPoolThread *> expiredThreads;
    QList<QueuePage *> queue;
    QWaitCondition noActiveThreads;
    QString objectName;

    std::chrono::duration<int, std::milli> expiryTimeout = std::chrono::seconds(30);
    int requestedMaxThreadCount = QThread::idealThreadCount();  // don't use this directly
    int reservedThreads = 0;
    int activeThreads = 0;
    uint stackSize = 0;
    QThread::Priority threadPriority = QThread::InheritPriority;
    QThread::QualityOfService serviceLevel = QThread::QualityOfService::Auto;
}